

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,mbedtls_cipher_info_t *cipher_info)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = -0x6100;
  if (ctx != (mbedtls_cipher_context_t *)0x0 && cipher_info != (mbedtls_cipher_info_t *)0x0) {
    ctx->iv[8] = '\0';
    ctx->iv[9] = '\0';
    ctx->iv[10] = '\0';
    ctx->iv[0xb] = '\0';
    ctx->iv[0xc] = '\0';
    ctx->iv[0xd] = '\0';
    ctx->iv[0xe] = '\0';
    ctx->iv[0xf] = '\0';
    ctx->iv_size = 0;
    ctx->unprocessed_len = 0;
    ctx->iv[0] = '\0';
    ctx->iv[1] = '\0';
    ctx->iv[2] = '\0';
    ctx->iv[3] = '\0';
    ctx->iv[4] = '\0';
    ctx->iv[5] = '\0';
    ctx->iv[6] = '\0';
    ctx->iv[7] = '\0';
    ctx->unprocessed_data[0] = '\0';
    ctx->unprocessed_data[1] = '\0';
    ctx->unprocessed_data[2] = '\0';
    ctx->unprocessed_data[3] = '\0';
    ctx->unprocessed_data[4] = '\0';
    ctx->unprocessed_data[5] = '\0';
    ctx->unprocessed_data[6] = '\0';
    ctx->unprocessed_data[7] = '\0';
    ctx->unprocessed_data[8] = '\0';
    ctx->unprocessed_data[9] = '\0';
    ctx->unprocessed_data[10] = '\0';
    ctx->unprocessed_data[0xb] = '\0';
    ctx->unprocessed_data[0xc] = '\0';
    ctx->unprocessed_data[0xd] = '\0';
    ctx->unprocessed_data[0xe] = '\0';
    ctx->unprocessed_data[0xf] = '\0';
    ctx->add_padding = (_func_void_uchar_ptr_size_t_size_t *)0x0;
    ctx->get_padding = (_func_int_uchar_ptr_size_t_size_t_ptr *)0x0;
    ctx->cipher_info = (mbedtls_cipher_info_t *)0x0;
    ctx->key_bitlen = 0;
    ctx->operation = MBEDTLS_DECRYPT;
    ctx->cipher_ctx = (void *)0x0;
    pvVar2 = (*cipher_info->base->ctx_alloc_func)();
    ctx->cipher_ctx = pvVar2;
    if (pvVar2 == (void *)0x0) {
      iVar1 = -0x6180;
    }
    else {
      ctx->cipher_info = cipher_info;
      iVar1 = 0;
      if (cipher_info->mode == MBEDTLS_MODE_CBC) {
        ctx->add_padding = add_pkcs_padding;
        ctx->get_padding = get_pkcs_padding;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_setup( mbedtls_cipher_context_t *ctx, const mbedtls_cipher_info_t *cipher_info )
{
    if( NULL == cipher_info || NULL == ctx )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    memset( ctx, 0, sizeof( mbedtls_cipher_context_t ) );

    if( NULL == ( ctx->cipher_ctx = cipher_info->base->ctx_alloc_func() ) )
        return( MBEDTLS_ERR_CIPHER_ALLOC_FAILED );

    ctx->cipher_info = cipher_info;

#if defined(MBEDTLS_CIPHER_MODE_WITH_PADDING)
    /*
     * Ignore possible errors caused by a cipher mode that doesn't use padding
     */
#if defined(MBEDTLS_CIPHER_PADDING_PKCS7)
    (void) mbedtls_cipher_set_padding_mode( ctx, MBEDTLS_PADDING_PKCS7 );
#else
    (void) mbedtls_cipher_set_padding_mode( ctx, MBEDTLS_PADDING_NONE );
#endif
#endif /* MBEDTLS_CIPHER_MODE_WITH_PADDING */

    return( 0 );
}